

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::injectImagesForKernel
          (CLIntercept *this,uint64_t enqueueCounter,cl_kernel kernel,cl_command_queue command_queue
          )

{
  _Rb_tree_color _Var1;
  uint uVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  iterator iVar5;
  mapped_type *pmVar6;
  ulong __new_size;
  ulong uVar7;
  undefined4 extraout_XMM0_Da;
  float __x;
  undefined4 extraout_XMM0_Db;
  cl_mem memobj;
  mapped_type *local_430;
  vector<char,_std::allocator<char>_> transferBuf;
  cl_kernel kernel_local;
  cl_command_queue local_3f0;
  uint64_t local_3e8;
  CMemAllocNumberMap *local_3e0;
  _Base_ptr local_3d8;
  _Rb_tree_node_base *local_3d0;
  string fileName;
  string prefix;
  size_t origin [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  ifstream is;
  int aiStack_320 [122];
  char tmpStr [256];
  
  kernel_local = kernel;
  local_3f0 = command_queue;
  local_3e8 = enqueueCounter;
  std::mutex::lock(&this->m_Mutex);
  transferBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  transferBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  transferBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  prefix.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&is,sc_DumpDirectoryName,(allocator *)tmpStr);
  OS::Services_Common::GetDumpDirectoryNameWithoutPid
            (&(this->m_OS).super_Services_Common,(string *)&is,&prefix);
  std::__cxx11::string::~string((string *)&is);
  std::__cxx11::string::append((char *)&prefix);
  pmVar3 = std::
           map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
           ::operator[](&this->m_KernelArgMemMap,&kernel_local);
  p_Var4 = (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3d0 = &(pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_3d8 = &(this->m_ImageInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3e0 = &this->m_MemAllocNumberMap;
  while (p_Var4 != local_3d0) {
    _Var1 = p_Var4[1]._M_color;
    memobj = (cl_mem)p_Var4[1]._M_parent;
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    iVar5 = std::
            _Rb_tree<_cl_mem_*,_std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>,_std::_Select1st<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
            ::find(&(this->m_ImageInfoMap)._M_t,&memobj);
    if (iVar5._M_node != local_3d8) {
      local_430 = std::
                  map<_cl_mem_*,_CLIntercept::SImageInfo,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
                  ::operator[](&this->m_ImageInfoMap,&memobj);
      _is = (pointer)memobj;
      pmVar6 = std::
               map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
               ::operator[](local_3e0,(key_type *)&is);
      uVar2 = *pmVar6;
      std::__cxx11::string::string((string *)&fileName,(string *)&prefix);
      snprintf(tmpStr,0x100,"%04u",local_3e8);
      std::__cxx11::string::append((char *)&fileName);
      std::__cxx11::string::append((char *)&fileName);
      std::__cxx11::string::append((char *)&fileName);
      getShortKernelName_abi_cxx11_((string *)&is,this,kernel_local);
      std::__cxx11::string::append((string *)&fileName);
      std::__cxx11::string::~string((string *)&is);
      snprintf(tmpStr,0x100,"%u",(ulong)_Var1);
      std::__cxx11::string::append((char *)&fileName);
      std::__cxx11::string::append((char *)&fileName);
      snprintf(tmpStr,0x100,"%04u",(ulong)uVar2);
      std::__cxx11::string::append((char *)&fileName);
      std::__cxx11::string::append((char *)&fileName);
      snprintf(tmpStr,0x100,"_%zux%zux%zu_%zubpp",local_430->Region[0],local_430->Region[1],
               local_430->Region[2],local_430->ElementSize << 3);
      std::__cxx11::string::append((char *)&fileName);
      std::__cxx11::string::append((char *)&fileName);
      std::ifstream::ifstream((string *)&is);
      std::ifstream::open((char *)&is,(_Ios_Openmode)fileName._M_dataplus._M_p);
      if (*(int *)((long)aiStack_320 + *(long *)(_is + -0x18)) == 0) {
        std::operator+(&local_360,"Injecting image file: ",&fileName);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)origin,
                       &local_360,"\n");
        log(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        std::__cxx11::string::~string((string *)origin);
        std::__cxx11::string::~string((string *)&local_360);
        std::istream::seekg((long)&is,_S_beg);
        __new_size = std::istream::tellg();
        __x = (float)std::istream::seekg((long)&is,_S_beg);
        uVar7 = local_430->Region[1] * local_430->Region[0] * local_430->Region[2] *
                local_430->ElementSize;
        if (uVar7 - __new_size == 0) {
          if ((ulong)((long)transferBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)transferBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start) < __new_size) {
            std::vector<char,_std::allocator<char>_>::resize(&transferBuf,__new_size);
          }
        }
        else {
          logf(this,__x);
        }
        if (uVar7 <= (ulong)((long)transferBuf.super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)transferBuf.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start)) {
          std::istream::read((char *)&is,
                             (long)transferBuf.super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
          origin[2] = 0;
          origin[0] = 0;
          origin[1] = 0;
          (*(this->m_Dispatch).clEnqueueWriteImage)
                    (local_3f0,memobj,1,origin,local_430->Region,0,0,
                     transferBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,0,(cl_event *)0x0,(cl_event *)0x0);
        }
      }
      std::ifstream::~ifstream((string *)&is);
      std::__cxx11::string::~string((string *)&fileName);
    }
  }
  std::__cxx11::string::~string((string *)&prefix);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&transferBuf.super__Vector_base<char,_std::allocator<char>_>);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::injectImagesForKernel(
    const uint64_t enqueueCounter,
    cl_kernel kernel,
    cl_command_queue command_queue )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    std::vector<char>   transferBuf;
    std::string prefix;

    OS().GetDumpDirectoryNameWithoutPid( sc_DumpDirectoryName, prefix );
    prefix += "/Inject/";

    CArgMemMap& kernelArgMemMap = m_KernelArgMemMap[ kernel ];
    CArgMemMap::iterator  i = kernelArgMemMap.begin();
    while( i != kernelArgMemMap.end() )
    {
        CLI_C_ASSERT( sizeof(void*) == sizeof(cl_mem) );

        cl_uint arg_index = (*i).first;
        cl_mem  memobj = (cl_mem)(*i).second;

        ++i;

        if( m_ImageInfoMap.find( memobj ) != m_ImageInfoMap.end() )
        {
            const SImageInfo&   info = m_ImageInfoMap[ memobj ];
            unsigned int        number = m_MemAllocNumberMap[ memobj ];

            std::string fileName( prefix );
            char    tmpStr[ MAX_PATH ];

            // Add the enqueue count to file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%04u",
                    (unsigned int)enqueueCounter );

                fileName += "Enqueue_";
                fileName += tmpStr;
            }

            // Add the kernel name to the file name
            {
                fileName += "_Kernel_";
                fileName += getShortKernelName(kernel);
            }

            // Add the arg number to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%u", arg_index );

                fileName += "_Arg_";
                fileName += tmpStr;
            }

            // Add the image number to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%04u", number );

                fileName += "_Image_";
                fileName += tmpStr;
            }

            // Add the image dimensions to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "_%zux%zux%zu_%zubpp",
                    info.Region[0],
                    info.Region[1],
                    info.Region[2],
                    info.ElementSize * 8 );

                fileName += tmpStr;
            }

            // Add extension to file name
            {
                fileName += ".raw";
            }

            std::ifstream is;
            is.open( fileName.c_str(), std::ios::in | std::ios::binary );
            if( is.good() )
            {
                log("Injecting image file: " + fileName + "\n");

                size_t  fileSize = 0;
                is.seekg( 0, std::ios::end );
                fileSize = (size_t)is.tellg();
                is.seekg( 0, std::ios::beg );

                size_t  size =
                    info.Region[0] *
                    info.Region[1] *
                    info.Region[2] *
                    info.ElementSize;

                if( size != fileSize )
                {
                    logf("Skipping injection: image size (%zu bytes) is not equal to file size (%zu bytes)!\n",
                        size, fileSize );
                }
                else if( transferBuf.size() < size )
                {
                    transferBuf.resize(size);
                }

                if( transferBuf.size() >= size )
                {
                    is.read( (char*)transferBuf.data(), size );

                    size_t  origin[3] = { 0, 0, 0 };
                    dispatch().clEnqueueWriteImage(
                        command_queue,
                        memobj,
                        CL_TRUE,
                        origin,
                        info.Region,
                        0,
                        0,
                        transferBuf.data(),
                        0,
                        NULL,
                        NULL );
                }
            }
        }
    }
}